

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

void __thiscall ON_Material::SetReflectivity(ON_Material *this,double reflectivity)

{
  double reflectivity_local;
  ON_Material *this_local;
  
  if (0.0 <= reflectivity) {
    if (reflectivity <= 1.0) {
      this->m_reflectivity = reflectivity;
    }
    else {
      this->m_reflectivity = 1.0;
    }
  }
  else {
    this->m_reflectivity = 0.0;
  }
  return;
}

Assistant:

void ON_Material::SetReflectivity( double reflectivity )
{
  if ( reflectivity < 0.0 )
    m_reflectivity = 0.0;
  else if ( reflectivity > 1.0)
    m_reflectivity = 1.0;
  else
    m_reflectivity = reflectivity;
}